

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderPackingFunctionCase::~ShaderPackingFunctionCase
          (ShaderPackingFunctionCase *this)

{
  ShaderPackingFunctionCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPackingFunctionCase_032b2bf0;
  deinit(this);
  deqp::gls::ShaderExecUtil::ShaderSpec::~ShaderSpec(&this->m_spec);
  gles31::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

ShaderPackingFunctionCase::~ShaderPackingFunctionCase (void)
{
	ShaderPackingFunctionCase::deinit();
}